

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Request::Request(Request *this)

{
  Request *this_local;
  
  std::make_unique<restincurl::EasyHandle>();
  this->request_type_ = INVALID;
  std::function<void_(const_restincurl::Result_&)>::function(&this->completion_);
  std::unique_ptr<restincurl::DataHandlerBase,std::default_delete<restincurl::DataHandlerBase>>::
  unique_ptr<std::default_delete<restincurl::DataHandlerBase>,void>
            ((unique_ptr<restincurl::DataHandlerBase,std::default_delete<restincurl::DataHandlerBase>>
              *)&this->default_out_handler_);
  std::unique_ptr<restincurl::DataHandlerBase,std::default_delete<restincurl::DataHandlerBase>>::
  unique_ptr<std::default_delete<restincurl::DataHandlerBase>,void>
            ((unique_ptr<restincurl::DataHandlerBase,std::default_delete<restincurl::DataHandlerBase>>
              *)&this->default_in_handler_);
  this->headers_ = (headers_t)0x0;
  std::__cxx11::string::string((string *)&this->default_data_buffer_);
  std::shared_ptr<_IO_FILE>::shared_ptr(&this->fp_);
  this->mime_ = (curl_mime *)0x0;
  return;
}

Assistant:

Request()
        : eh_{std::make_unique<EasyHandle>()}
        {
        }